

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O3

void formatFailMessage<QLatin1String,QStringView>
               (char *msg,size_t maxMsgLen,char *failureMsg,QLatin1String *val1,QStringView *val2,
               char *actual,char *expected,ComparisonOperation op)

{
  char *pcVar1;
  char *val2_00;
  storage_type_conflict *extraout_RDX;
  storage_type_conflict *extraout_RDX_00;
  storage_type_conflict *extraout_RDX_01;
  storage_type_conflict *psVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QStringView string;
  QStringView string_00;
  QArrayData *local_50;
  qsizetype local_48;
  QTest *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (char *)0x0;
  if (0 < (long)failureMsg) {
    pcVar1 = failureMsg;
  }
  if (val1 == (QLatin1String *)0x0) {
    pcVar1 = (char *)0x0;
  }
  if (val1 != (QLatin1String *)0x0 && (long)failureMsg < 0) {
    pcVar1 = (char *)strlen((char *)val1);
  }
  QVar3.m_data = pcVar1;
  QVar3.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar3);
  string.m_data = extraout_RDX;
  string.m_size = local_48;
  pcVar1 = QTest::toPrettyUnicode(local_40,string);
  psVar2 = extraout_RDX_00;
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
      psVar2 = extraout_RDX_01;
    }
  }
  string_00.m_data = psVar2;
  string_00.m_size = (qsizetype)val2->m_data;
  val2_00 = QTest::toPrettyUnicode((QTest *)val2->m_size,string_00);
  formatFailMessage(msg,0x1000,(char *)maxMsgLen,pcVar1,val2_00,actual,expected,CustomCompare);
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  if (val2_00 != (char *)0x0) {
    operator_delete__(val2_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static Q_DECL_COLD_FUNCTION
void formatFailMessage(char *msg, size_t maxMsgLen,
                       const char *failureMsg,
                       const Actual &val1, const Expected &val2,
                       const char *actual, const char *expected,
                       QTest::ComparisonOperation op)
{
    const char *val1S = QTest::toString(val1);
    const char *val2S = QTest::toString(val2);

    formatFailMessage(msg, maxMsgLen, failureMsg, val1S, val2S, actual, expected, op);

    delete [] val1S;
    delete [] val2S;
}